

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<int,_false,_6> __thiscall
immutable::vector<int,_false,_6>::erase
          (vector<int,_false,_6> *this,size_type_conflict from,size_type_conflict to)

{
  rrb<int,_false,_6> *prVar1;
  uint in_ECX;
  undefined4 in_register_00000034;
  vector<int,_false,_6> vStack_28;
  vector<int,_false,_6> local_20;
  
  if (to < in_ECX) {
    take(&local_20,from);
    drop(&vStack_28,from);
    operator+((immutable *)this,&local_20,&vStack_28);
    ref<immutable::rrb<int,_false,_6>_>::~ref(&vStack_28._impl);
    ref<immutable::rrb<int,_false,_6>_>::~ref(&local_20._impl);
  }
  else {
    prVar1 = *(rrb<int,_false,_6> **)CONCAT44(in_register_00000034,from);
    (this->_impl).ptr = prVar1;
    if (prVar1 != (rrb<int,_false,_6> *)0x0) {
      prVar1->_ref_count = prVar1->_ref_count + 1;
    }
  }
  return (vector<int,_false,_6>)(ref<immutable::rrb<int,_false,_6>_>)this;
}

Assistant:

vector erase(size_type from, size_type to) const
        {
        return to > from ? take(from) + drop(to) : *this;
        }